

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_is_before_sibling(xml_node_struct *ln,xml_node_struct *rn)

{
  xml_node_struct *local_30;
  xml_node_struct *rs;
  xml_node_struct *ls;
  xml_node_struct *rn_local;
  xml_node_struct *ln_local;
  
  if (ln->parent != rn->parent) {
    __assert_fail("ln->parent == rn->parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                  ,0x1f57,
                  "bool pugi::impl::(anonymous namespace)::node_is_before_sibling(xml_node_struct *, xml_node_struct *)"
                 );
  }
  local_30 = rn;
  rs = ln;
  if (ln->parent == (xml_node_struct *)0x0) {
    ln_local._7_1_ = ln < rn;
  }
  else {
    for (; rs != (xml_node_struct *)0x0 && local_30 != (xml_node_struct *)0x0; rs = rs->next_sibling
        ) {
      if (rs == rn) {
        return true;
      }
      if (local_30 == ln) {
        return false;
      }
      local_30 = local_30->next_sibling;
    }
    ln_local._7_1_ = local_30 == (xml_node_struct *)0x0;
  }
  return ln_local._7_1_;
}

Assistant:

PUGI__FN bool node_is_before_sibling(xml_node_struct* ln, xml_node_struct* rn)
	{
		assert(ln->parent == rn->parent);

		// there is no common ancestor (the shared parent is null), nodes are from different documents
		if (!ln->parent) return ln < rn;

		// determine sibling order
		xml_node_struct* ls = ln;
		xml_node_struct* rs = rn;

		while (ls && rs)
		{
			if (ls == rn) return true;
			if (rs == ln) return false;

			ls = ls->next_sibling;
			rs = rs->next_sibling;
		}

		// if rn sibling chain ended ln must be before rn
		return !rs;
	}